

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

int __thiscall NodeSet::get_index(NodeSet *this,vector<int,_std::allocator<int>_> *lbl)

{
  pointer pvVar1;
  pointer pvVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  int iVar5;
  
  sVar3 = std::
          map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::count(&this->index,lbl);
  if (sVar3 == 0) {
    pvVar1 = (this->labels).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar2 = (this->labels).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->labels,lbl);
    pmVar4 = std::
             map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ::operator[](&this->index,lbl);
    iVar5 = (int)(((long)pvVar1 - (long)pvVar2) / 0x18);
    *pmVar4 = iVar5;
  }
  else {
    pmVar4 = std::
             map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ::operator[](&this->index,lbl);
    iVar5 = *pmVar4;
  }
  return iVar5;
}

Assistant:

int NodeSet::get_index(const std::vector<int> &lbl) {
	if (index.count(lbl)) {
		return index[lbl];
	} else {
		int ind = labels.size();
		labels.push_back(lbl);
		index[lbl] = ind;
		return ind;
	}
}